

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector_tests.cpp
# Opt level: O2

void __thiscall prevector_tests::prevector_tester<8U,_int>::test(prevector_tester<8U,_int> *this)

{
  pretype *other;
  int *piVar1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  pointer piVar2;
  uint uVar3;
  pretype *ppVar4;
  long lVar5;
  iterator first_00;
  int *piVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  pretype *__range2;
  long in_FS_OFFSET;
  DataStream local_78;
  direct_or_indirect local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  other = &this->pre_vector;
  first._M_current =
       (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start;
  last._M_current =
       (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  uVar7 = (this->pre_vector)._size;
  uVar3 = uVar7 - 9;
  if (uVar7 < 9) {
    uVar3 = uVar7;
  }
  ppVar4 = (pretype *)(this->pre_vector)._union.indirect_contents.indirect;
  if (uVar7 < 9) {
    ppVar4 = other;
  }
  uVar10 = (long)last._M_current - (long)first._M_current;
  bVar9 = (bool)((uVar3 != 0) != (uVar10 == 0) & (long)uVar10 >> 2 == (ulong)uVar3 & this->passed);
  this->passed = bVar9;
  uVar8 = 0;
  while (uVar8 < (ulong)((long)uVar10 >> 2)) {
    iVar12 = (int)uVar8;
    piVar6 = (int *)((long)&ppVar4->_union + (long)iVar12 * 4);
    bVar9 = (bool)(piVar6 == (int *)((long)ppVar4 +
                                    uVar8 * 4 + ((long)(int)uVar3 * 4 - (uVar10 & 0x3fffffffc))) &
                   bVar9 & (long)iVar12 == uVar8 & first._M_current[uVar8] == *piVar6);
    this->passed = bVar9;
    uVar8 = (ulong)(iVar12 + 1);
  }
  prevector<8U,_int,_unsigned_int,_int>::
  prevector<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
            ((prevector<8U,_int,_unsigned_int,_int> *)&local_58.indirect_contents,first,last);
  bVar9 = prevector<8U,_int,_unsigned_int,_int>::operator==
                    ((prevector<8U,_int,_unsigned_int,_int> *)&local_58.indirect_contents,other);
  this->passed = (bool)(this->passed & bVar9);
  prevector<8U,_int,_unsigned_int,_int>::~prevector
            ((prevector<8U,_int,_unsigned_int,_int> *)&local_58.indirect_contents);
  uVar7 = (this->pre_vector)._size;
  first_00.ptr = (int *)other;
  if (8 < uVar7) {
    first_00.ptr = (int *)(this->pre_vector)._union.indirect_contents.indirect;
    uVar7 = uVar7 - 9;
  }
  prevector<8U,_int,_unsigned_int,_int>::prevector<prevector<8U,_int,_unsigned_int,_int>::iterator>
            ((prevector<8U,_int,_unsigned_int,_int> *)&local_58.indirect_contents,first_00,
             (iterator)(first_00.ptr + (int)uVar7));
  bVar9 = prevector<8U,_int,_unsigned_int,_int>::operator==
                    ((prevector<8U,_int,_unsigned_int,_int> *)&local_58.indirect_contents,other);
  this->passed = (bool)(this->passed & bVar9);
  prevector<8U,_int,_unsigned_int,_int>::~prevector
            ((prevector<8U,_int,_unsigned_int,_int> *)&local_58.indirect_contents);
  uVar7 = (this->pre_vector)._size;
  ppVar4 = other;
  if (8 < uVar7) {
    ppVar4 = (pretype *)(this->pre_vector)._union.indirect_contents.indirect;
    uVar7 = uVar7 - 9;
  }
  piVar2 = (this->real_vector).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar9 = this->passed != false;
  piVar6 = piVar2 + -1;
  lVar5 = (long)(int)uVar7 * 4;
  for (lVar11 = 0; lVar5 - lVar11 != 0; lVar11 = lVar11 + 4) {
    piVar1 = piVar6 + 1;
    piVar6 = piVar6 + 1;
    bVar9 = (bool)(bVar9 & *(int *)((long)&ppVar4->_union + lVar11) == *piVar1);
    this->passed = bVar9;
  }
  for (; lVar5 != 0; lVar5 = lVar5 + -4) {
    bVar9 = (bool)(bVar9 & *(int *)((long)ppVar4 + lVar5 + -4) == *piVar6);
    this->passed = bVar9;
    piVar6 = piVar6 + -1;
  }
  piVar6 = piVar2 + -1;
  lVar5 = (long)(int)uVar7 * 4;
  for (lVar11 = 0; lVar5 != lVar11; lVar11 = lVar11 + 4) {
    piVar1 = piVar6 + 1;
    piVar6 = piVar6 + 1;
    bVar9 = (bool)(bVar9 & *(int *)((long)&ppVar4->_union + lVar11) == *piVar1);
    this->passed = bVar9;
  }
  for (; lVar5 != 0; lVar5 = lVar5 + -4) {
    bVar9 = (bool)(bVar9 & *(int *)((long)ppVar4 + lVar5 + -4) == *piVar6);
    this->passed = bVar9;
    piVar6 = piVar6 + -1;
  }
  local_58._16_8_ = 0;
  local_58._24_8_ = 0;
  local_58.indirect_contents.indirect = (char *)0x0;
  local_58._8_8_ = 0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.m_read_pos = 0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  Serialize<DataStream,int,std::allocator<int>>
            ((DataStream *)&local_58.indirect_contents,&this->real_vector);
  Serialize<DataStream,8u,int>(&local_78,other);
  uVar10 = local_58._8_8_ - (long)(local_58._0_8_ + local_58._24_8_);
  bVar9 = (bool)(uVar10 == (long)local_78.vch.
                                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_78.vch.
                                  super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                  ._M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos) &
                this->passed);
  this->passed = bVar9;
  for (uVar7 = 0; uVar8 = (ulong)uVar7, uVar8 < uVar10; uVar7 = uVar7 + 1) {
    bVar9 = (bool)(bVar9 & ((char *)(local_58._0_8_ + local_58._24_8_))[uVar8] ==
                           (local_78.vch.
                            super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                            _M_impl.super__Vector_impl_data._M_start + local_78.m_read_pos)[uVar8]);
    this->passed = bVar9;
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_78);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)
             &local_58.indirect_contents);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void test() {
        const pretype& const_pre_vector = pre_vector;
        local_check_equal(real_vector.size(), pre_vector.size());
        local_check_equal(real_vector.empty(), pre_vector.empty());
        for (Size s = 0; s < real_vector.size(); s++) {
             local_check(real_vector[s] == pre_vector[s]);
             local_check(&(pre_vector[s]) == &(pre_vector.begin()[s]));
             local_check(&(pre_vector[s]) == &*(pre_vector.begin() + s));
             local_check(&(pre_vector[s]) == &*((pre_vector.end() + s) - real_vector.size()));
        }
        // local_check(realtype(pre_vector) == real_vector);
        local_check(pretype(real_vector.begin(), real_vector.end()) == pre_vector);
        local_check(pretype(pre_vector.begin(), pre_vector.end()) == pre_vector);
        size_t pos = 0;
        for (const T& v : pre_vector) {
             local_check(v == real_vector[pos++]);
        }
        for (const T& v : pre_vector | std::views::reverse) {
            local_check(v == real_vector[--pos]);
        }
        for (const T& v : const_pre_vector) {
             local_check(v == real_vector[pos++]);
        }
        for (const T& v : const_pre_vector | std::views::reverse) {
            local_check(v == real_vector[--pos]);
        }
        DataStream ss1{};
        DataStream ss2{};
        ss1 << real_vector;
        ss2 << pre_vector;
        local_check_equal(ss1.size(), ss2.size());
        for (Size s = 0; s < ss1.size(); s++) {
            local_check_equal(ss1[s], ss2[s]);
        }
    }